

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qislamiccivilcalendar.cpp
# Opt level: O2

QStringList * QIslamicCivilCalendar::nameList(void)

{
  QList<QString> *in_RDI;
  long lVar1;
  long in_FS_OFFSET;
  initializer_list<QString> args;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  undefined8 local_60;
  char16_t *local_58;
  undefined8 local_50;
  undefined8 local_48;
  char16_t *local_40;
  undefined8 local_38;
  undefined8 local_30;
  char16_t *local_28;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d = (Data *)0x0;
  local_90.d = (Data *)0x0;
  local_90.ptr = (char16_t *)0x0;
  local_78.ptr = L"Islamic Civil";
  local_90.size = 0;
  local_78.size = 0xd;
  local_60 = 0;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  local_a8.size = 0;
  local_58 = L"islamic-civil";
  local_50 = 0xd;
  local_c0.d = (Data *)0x0;
  local_c0.ptr = (char16_t *)0x0;
  local_48 = 0;
  local_40 = L"islamicc";
  local_c0.size = 0;
  local_38 = 8;
  local_30 = 0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (char16_t *)0x0;
  local_28 = L"Islamic";
  local_d8.size = 0;
  local_20 = 7;
  args._M_len = 4;
  args._M_array = (iterator)&local_78;
  QList<QString>::QList(in_RDI,args);
  lVar1 = 0x48;
  do {
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)((long)&local_78.d + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QIslamicCivilCalendar::nameList()
{
    return {
        QStringLiteral("Islamic Civil"),
        QStringLiteral("islamic-civil"), // CLDR name
        QStringLiteral("islamicc"), // old CLDR name, still (2018) used by Mozilla
        // Until we have a concrete implementation that knows all the needed ephemerides:
        QStringLiteral("Islamic"),
    };
}